

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build.cc
# Opt level: O2

string * __thiscall
BuildStatus::FormatProgressStatus_abi_cxx11_
          (string *__return_storage_ptr__,BuildStatus *this,char *progress_status_format,
          EdgeStatus status)

{
  double dVar1;
  char cVar2;
  ulong uVar3;
  char *__format;
  char cVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  string out;
  char buf [32];
  
  out._M_dataplus._M_p = (pointer)&out.field_2;
  out._M_string_length = 0;
  out.field_2._M_local_buf[0] = '\0';
  do {
    cVar4 = (char)&out;
    if (*progress_status_format != '%') {
      if (*progress_status_format == '\0') {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)out._M_dataplus._M_p == &out.field_2) {
          (__return_storage_ptr__->field_2)._M_allocated_capacity =
               CONCAT71(out.field_2._M_allocated_capacity._1_7_,out.field_2._M_local_buf[0]);
          *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = out.field_2._8_8_;
        }
        else {
          (__return_storage_ptr__->_M_dataplus)._M_p = out._M_dataplus._M_p;
          (__return_storage_ptr__->field_2)._M_allocated_capacity =
               CONCAT71(out.field_2._M_allocated_capacity._1_7_,out.field_2._M_local_buf[0]);
        }
        __return_storage_ptr__->_M_string_length = out._M_string_length;
        out._M_string_length = 0;
        out.field_2._M_local_buf[0] = '\0';
        out._M_dataplus._M_p = (pointer)&out.field_2;
        std::__cxx11::string::~string((string *)&out);
        return __return_storage_ptr__;
      }
      std::__cxx11::string::push_back(cVar4);
      goto LAB_0010755c;
    }
    cVar2 = progress_status_format[1];
    progress_status_format = progress_status_format + 1;
    switch(cVar2) {
    case 'c':
      SlidingRateInfo::UpdateRate(&this->current_rate_,this->finished_edges_);
      dVar1 = (this->current_rate_).rate_;
      uVar5 = SUB84(dVar1,0);
      uVar6 = (undefined4)((ulong)dVar1 >> 0x20);
      goto LAB_001074dd;
    case 'd':
    case 'g':
    case 'h':
    case 'i':
    case 'j':
    case 'k':
    case 'l':
    case 'm':
    case 'n':
    case 'q':
switchD_00107476_caseD_64:
      Fatal("unknown placeholder \'%%%c\' in $NINJA_STATUS",(ulong)(uint)(int)cVar2);
    case 'e':
      dVar1 = Stopwatch::Elapsed(&(this->overall_rate_).stopwatch_);
      snprintf(buf,0x20,"%.3f",SUB84(dVar1,0));
      std::__cxx11::string::append((char *)&out);
      goto LAB_0010755c;
    case 'f':
      uVar3 = (ulong)(uint)this->finished_edges_;
      break;
    case 'o':
      RateInfo::UpdateRate(&this->overall_rate_,this->finished_edges_);
      dVar1 = (this->overall_rate_).rate_;
      uVar5 = SUB84(dVar1,0);
      uVar6 = (undefined4)((ulong)dVar1 >> 0x20);
LAB_001074dd:
      SnprintfRate<32ul>(this,(double)CONCAT44(uVar6,uVar5),&buf,"%.1f");
      goto LAB_00107551;
    case 'p':
      __format = "%3i%%";
      uVar3 = (long)(this->finished_edges_ * 100) / (long)this->total_edges_ & 0xffffffff;
      goto LAB_0010754a;
    case 'r':
      snprintf(buf,0x20,"%d",
               (ulong)((this->started_edges_ + (uint)(status == kEdgeFinished)) -
                      this->finished_edges_));
      std::__cxx11::string::append((char *)&out);
      goto LAB_0010755c;
    case 's':
      uVar3 = (ulong)(uint)this->started_edges_;
      break;
    case 't':
      uVar3 = (ulong)(uint)this->total_edges_;
      break;
    case 'u':
      uVar3 = (ulong)(uint)(this->total_edges_ - this->started_edges_);
      break;
    default:
      if (cVar2 != '%') goto switchD_00107476_caseD_64;
      std::__cxx11::string::push_back(cVar4);
      goto LAB_0010755c;
    }
    __format = "%d";
LAB_0010754a:
    snprintf(buf,0x20,__format,uVar3);
LAB_00107551:
    std::__cxx11::string::append((char *)&out);
LAB_0010755c:
    progress_status_format = progress_status_format + 1;
  } while( true );
}

Assistant:

string BuildStatus::FormatProgressStatus(
    const char* progress_status_format, EdgeStatus status) const {
  string out;
  char buf[32];
  int percent;
  for (const char* s = progress_status_format; *s != '\0'; ++s) {
    if (*s == '%') {
      ++s;
      switch (*s) {
      case '%':
        out.push_back('%');
        break;

        // Started edges.
      case 's':
        snprintf(buf, sizeof(buf), "%d", started_edges_);
        out += buf;
        break;

        // Total edges.
      case 't':
        snprintf(buf, sizeof(buf), "%d", total_edges_);
        out += buf;
        break;

        // Running edges.
      case 'r': {
        int running_edges = started_edges_ - finished_edges_;
        // count the edge that just finished as a running edge
        if (status == kEdgeFinished)
          running_edges++;
        snprintf(buf, sizeof(buf), "%d", running_edges);
        out += buf;
        break;
      }

        // Unstarted edges.
      case 'u':
        snprintf(buf, sizeof(buf), "%d", total_edges_ - started_edges_);
        out += buf;
        break;

        // Finished edges.
      case 'f':
        snprintf(buf, sizeof(buf), "%d", finished_edges_);
        out += buf;
        break;

        // Overall finished edges per second.
      case 'o':
        overall_rate_.UpdateRate(finished_edges_);
        SnprintfRate(overall_rate_.rate(), buf, "%.1f");
        out += buf;
        break;

        // Current rate, average over the last '-j' jobs.
      case 'c':
        current_rate_.UpdateRate(finished_edges_);
        SnprintfRate(current_rate_.rate(), buf, "%.1f");
        out += buf;
        break;

        // Percentage
      case 'p':
        percent = (100 * finished_edges_) / total_edges_;
        snprintf(buf, sizeof(buf), "%3i%%", percent);
        out += buf;
        break;

      case 'e': {
        double elapsed = overall_rate_.Elapsed();
        snprintf(buf, sizeof(buf), "%.3f", elapsed);
        out += buf;
        break;
      }

      default:
        Fatal("unknown placeholder '%%%c' in $NINJA_STATUS", *s);
        return "";
      }
    } else {
      out.push_back(*s);
    }
  }

  return out;
}